

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap_cubical_complex_base.h
# Opt level: O0

void __thiscall
Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>::~Bitmap_cubical_complex_base
          (Bitmap_cubical_complex_base<double> *this)

{
  Bitmap_cubical_complex_base<double> *this_local;
  
  ~Bitmap_cubical_complex_base(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

virtual ~Bitmap_cubical_complex_base() {}